

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O3

void compress_block(astcenc_contexti *ctx,image_block *blk,uint8_t *pcb,
                   compression_working_buffers *tmpbuf)

{
  endpoints_and_weights *ei2;
  float *dec_weight_ideal_value;
  decimation_info *pdVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  astcenc_profile decode_mode;
  uint uVar8;
  block_size_descriptor *bsd;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint8_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  partition_info *pi;
  int iVar16;
  ulong uVar17;
  uint16_t *puVar18;
  long lVar19;
  uint uVar20;
  byte *pbVar21;
  decimation_info *pdVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float default_alpha;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vfloat4 color0;
  vfloat4 color1;
  vfloat4 rgbs_color_00;
  vfloat4 rgbo_color_00;
  float errorval_mult [2];
  symbolic_compressed_block workscb;
  vfloat4 rgbo_color;
  vfloat4 rgbs_color;
  quant_method color_quant_level [8];
  int block_mode_index [8];
  uint8_t partition_format_specifiers [8] [4];
  endpoints epm;
  quant_method color_quant_level_mod [8];
  undefined1 local_570 [16];
  float local_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  uint local_4d0;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined8 uStack_428;
  int8_t *local_418;
  ulong local_410;
  float local_408 [3];
  undefined8 local_3fc;
  undefined4 local_3f4;
  undefined1 *local_3e8;
  float *local_3e0;
  uint16_t *local_3d8;
  float *local_3d0;
  uint8_t *local_3c8;
  undefined8 local_3c0;
  uint local_3b8 [2];
  undefined8 local_3b0;
  uint local_3a8;
  undefined1 local_3a0 [128];
  undefined1 local_320 [128];
  vfloat4 local_2a0;
  vfloat4 local_290;
  quant_method local_280 [8];
  int local_260 [8];
  byte local_240 [32];
  endpoints local_220;
  quant_method local_110 [8];
  endpoints local_f0;
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  
  bsd = ctx->bsd;
  uVar7 = (ctx->config).tune_partition_count_limit;
  local_3b0._0_4_ = (ctx->config).tune_2partition_index_limit;
  local_3b0._4_4_ = (ctx->config).tune_3partition_index_limit;
  local_3a8 = (ctx->config).tune_4partition_index_limit;
  local_3c0._0_4_ = (ctx->config).tune_2partitioning_candidate_limit;
  local_3c0._4_4_ = (ctx->config).tune_3partitioning_candidate_limit;
  local_3b8[0] = (ctx->config).tune_4partitioning_candidate_limit;
  auVar31 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                       *(undefined1 (*) [16])(blk->data_min).m,4);
  auVar33 = ZEXT416((uint)(blk->data_max).m[3]);
  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar31[0xf]) {
    local_320[1] = '\0';
    auVar31 = *(undefined1 (*) [16])(blk->origin_texel).m;
    if (((ctx->config).profile & ~ASTCENC_PRF_LDR) == ASTCENC_PRF_HDR_RGB_LDR_A) {
      auVar31 = vcvtps2ph_f16c(auVar31,0);
      auVar33 = vpmovzxwd_avx(auVar31);
      local_320[0] = '\x01';
    }
    else {
      auVar31 = vmaxps_avx(auVar31,ZEXT816(0));
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar31 = vminps_avx(auVar31,auVar40);
      auVar33._0_4_ = (int)(auVar31._0_4_ * 65535.0 + 0.5);
      auVar33._4_4_ = (int)(auVar31._4_4_ * 65535.0 + 0.5);
      auVar33._8_4_ = (int)(auVar31._8_4_ * 65535.0 + 0.5);
      auVar33._12_4_ = (int)(auVar31._12_4_ * 65535.0 + 0.5);
      local_320[0] = '\x02';
    }
    local_320._20_4_ = auVar33._0_4_;
    local_320._24_4_ = auVar33._4_4_;
    local_320._28_4_ = auVar33._8_4_;
    local_320._32_4_ = auVar33._12_4_;
  }
  else {
    uVar13 = *(uint *)(&DAT_0032b6e0 + (ulong)(blk->alpha_lns[0] == '\0') * 4);
    auVar31 = vcmpps_avx(auVar33,ZEXT416(uVar13),4);
    auVar30 = ZEXT416((uint)(blk->data_min).m[3]);
    auVar40 = vcmpps_avx(auVar30,ZEXT416(uVar13),4);
    auVar40 = vorps_avx(auVar40,auVar31);
    auVar31 = vcmpps_avx(auVar33,ZEXT416(uVar13),0);
    auVar33 = vcmpps_avx(auVar30,ZEXT416(uVar13),0);
    auVar31 = vandps_avx(auVar33,auVar31);
    if (blk->grayscale == false) {
      fVar25 = 1.0;
      fVar26 = 1.0;
    }
    else {
      fVar25 = 0.952381;
      fVar26 = 0.6666667;
    }
    if ((auVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar25 = 1.0;
    }
    local_3c8 = pcb;
    if ((auVar31 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar26 = 1.0;
    }
    uVar3 = *(undefined8 *)((blk->channel_weight).m + 2);
    fVar51 = (float)uVar3;
    auVar31._0_4_ = fVar51 + (blk->channel_weight).m[0];
    fVar46 = (float)((ulong)uVar3 >> 0x20);
    auVar31._4_4_ = fVar46 + (blk->channel_weight).m[1];
    auVar31._8_4_ = fVar51 + (blk->channel_weight).m[2];
    auVar31._12_4_ = fVar46 + (blk->channel_weight).m[3];
    auVar31 = vhaddps_avx(auVar31,auVar31);
    local_320._16_4_ = 1e+30;
    local_320[0] = '\0';
    local_430 = 0x7149f2ca7149f2ca;
    uStack_428 = 0x7149f2ca7149f2ca;
    local_408[2] = 0.0;
    local_3fc._0_4_ = (ctx->config).tune_2partition_early_out_limit_factor;
    local_3fc._4_4_ = (ctx->config).tune_3partition_early_out_limit_factor;
    local_3f4 = 0;
    fVar51 = 1.0 / (ctx->config).tune_mse_overshoot;
    local_408[0] = fVar51;
    local_408[1] = 1.0;
    uVar17 = 1;
    if (0.85 <= (ctx->config).tune_search_mode0_enable) {
      uVar17 = (ulong)(bsd->zdim != '\x01');
    }
    fVar25 = fVar25 * fVar26 * auVar31._0_4_ * (float)bsd->texel_count * (ctx->config).tune_db_limit
    ;
    auVar36 = ZEXT464(0x7149f2ca);
    do {
      fVar26 = local_408[uVar17];
      auVar62._0_4_ =
           compress_symbolic_block_for_partition_1plane
                     (&ctx->config,bsd,blk,uVar17 == 0,fVar25 * fVar26 * fVar51,1,0,
                      (symbolic_compressed_block *)local_320,tmpbuf,0xb);
      auVar62._4_60_ = extraout_var;
      uVar6 = bsd->block_mode_packed_index[(ushort)local_320._4_2_];
      if ((uVar6 == 0xffff) ||
         (bsd->block_mode_count_all < (uint)uVar6 || bsd->block_mode_count_all == (uint)uVar6)) {
        __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                      ,0x27f,
                      "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const")
        ;
      }
      if (auVar62._0_4_ < fVar25 * fVar26) goto LAB_00266048;
      auVar31 = vminss_avx(ZEXT416(auVar36._0_4_),auVar62._0_16_);
      auVar36 = ZEXT1664(auVar31);
      bVar24 = uVar17 == 0;
      uVar17 = 1;
    } while (bVar24);
    local_410 = (ulong)bsd->block_modes[uVar6].quant_mode;
    local_430 = CONCAT44(local_430._4_4_,auVar31._0_4_);
    if ((ulong)bsd->texel_count == 0) {
      __assert_fail("texels_per_block > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                    ,0x42f,"float prepare_block_statistics(int, const image_block &)");
    }
    uVar3 = *(undefined8 *)((blk->channel_weight).m + 2);
    fVar26 = (float)uVar3;
    auVar30._0_4_ = fVar26 + (blk->channel_weight).m[0];
    fVar46 = (float)((ulong)uVar3 >> 0x20);
    auVar30._4_4_ = fVar46 + (blk->channel_weight).m[1];
    auVar30._8_4_ = fVar26 + (blk->channel_weight).m[2];
    auVar30._12_4_ = fVar46 + (blk->channel_weight).m[3];
    auVar31 = vhaddps_avx(auVar30,auVar30);
    fVar46 = auVar31._0_4_ * 0.25;
    fVar26 = 0.0;
    if (fVar46 < 0.0) {
      __assert_fail("weight >= 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                    ,0x433,"float prepare_block_statistics(int, const image_block &)");
    }
    uVar17 = 0;
    fVar67 = 0.0;
    fVar29 = 0.0;
    fVar53 = 0.0;
    fVar27 = 0.0;
    fVar72 = 0.0;
    fVar73 = 0.0;
    fVar74 = 0.0;
    fVar75 = 0.0;
    fVar68 = 0.0;
    fVar69 = 0.0;
    fVar70 = 0.0;
    fVar71 = 0.0;
    fVar52 = 0.0;
    fVar57 = 0.0;
    fVar58 = 0.0;
    fVar59 = 0.0;
    auVar31 = ZEXT416(0) << 0x20;
    do {
      fVar28 = blk->data_g[uVar17];
      fVar9 = fVar46 * blk->data_r[uVar17];
      fVar26 = fVar9 + fVar26;
      fVar29 = fVar29 + fVar9 * blk->data_r[uVar17];
      fVar2 = blk->data_b[uVar17];
      auVar33 = vinsertps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar2),0x10);
      auVar65._4_4_ = fVar9;
      auVar65._0_4_ = fVar9;
      auVar65._8_4_ = fVar9;
      auVar65._12_4_ = fVar9;
      fVar68 = fVar68 + auVar33._0_4_ * fVar9;
      fVar69 = fVar69 + auVar33._4_4_ * fVar9;
      fVar70 = fVar70 + auVar33._8_4_ * fVar9;
      fVar71 = fVar71 + auVar33._12_4_ * fVar9;
      fVar9 = fVar28 * fVar46;
      fVar53 = fVar28 * fVar9 + fVar53;
      auVar33 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)blk->data_a[uVar17]),0x10);
      auVar66._0_4_ = auVar33._0_4_ * fVar46;
      auVar66._4_4_ = auVar33._4_4_ * fVar46;
      auVar66._8_4_ = auVar33._8_4_ * fVar46;
      auVar66._12_4_ = auVar33._12_4_ * fVar46;
      auVar32._0_4_ = auVar33._0_4_ * auVar66._0_4_ + auVar31._0_4_;
      auVar32._4_4_ = auVar33._4_4_ * auVar66._4_4_ + auVar31._4_4_;
      auVar32._8_4_ = auVar33._8_4_ * auVar66._8_4_ + auVar31._8_4_;
      auVar32._12_4_ = auVar33._12_4_ * auVar66._12_4_ + auVar31._12_4_;
      auVar31 = vinsertps_avx(ZEXT416((uint)blk->data_a[uVar17]),ZEXT416((uint)fVar2),0x10);
      fVar67 = fVar67 + fVar9;
      auVar33 = vinsertps_avx(auVar66,ZEXT416((uint)fVar9),0x10);
      auVar64._0_8_ = auVar33._0_8_;
      auVar64._8_8_ = auVar65._8_8_;
      auVar31 = vshufps_avx(auVar31,auVar31,0x10);
      auVar33 = vshufps_avx(auVar64,auVar64,0xd4);
      fVar52 = fVar52 + auVar33._0_4_ * auVar31._0_4_;
      fVar57 = fVar57 + auVar33._4_4_ * auVar31._4_4_;
      fVar58 = fVar58 + auVar33._8_4_ * auVar31._8_4_;
      fVar59 = fVar59 + auVar33._12_4_ * auVar31._12_4_;
      fVar72 = fVar72 + auVar66._0_4_;
      fVar73 = fVar73 + auVar66._4_4_;
      fVar74 = fVar74 + auVar66._8_4_;
      fVar75 = fVar75 + auVar66._12_4_;
      fVar27 = fVar46 + fVar27;
      uVar17 = uVar17 + 1;
      auVar31 = auVar32;
    } while (bsd->texel_count != uVar17);
    auVar31 = vmaxss_avx(ZEXT416((uint)fVar27),ZEXT416(0x33d6bf95));
    fVar46 = 1.0 / auVar31._0_4_;
    local_440 = ZEXT416((uint)(fVar46 * fVar26));
    fVar29 = fVar29 - fVar26 * fVar46 * fVar26;
    fVar53 = fVar53 - fVar67 * fVar67 * fVar46;
    local_510._4_4_ = fVar73 * fVar46;
    local_510._0_4_ = fVar72 * fVar46;
    fStack_508 = fVar74 * fVar46;
    fStack_504 = fVar75 * fVar46;
    auVar39._0_4_ = fVar72 * fVar72 * fVar46;
    auVar39._4_4_ = fVar73 * fVar73 * fVar46;
    auVar39._8_4_ = fVar74 * fVar74 * fVar46;
    auVar39._12_4_ = fVar75 * fVar75 * fVar46;
    auVar31 = vsubps_avx(auVar32,auVar39);
    fVar26 = fVar29 * fVar53;
    if (fVar26 < 0.0) {
      auVar36._0_4_ = sqrtf(fVar26);
      auVar36._4_60_ = extraout_var_00;
      auVar33 = auVar36._0_16_;
    }
    else {
      auVar33 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    }
    local_570._0_4_ = auVar31._0_4_;
    fVar26 = fVar29 * (float)local_570._0_4_;
    if (fVar26 < 0.0) {
      fVar26 = sqrtf(fVar26);
    }
    else {
      auVar40 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar26 = auVar40._0_4_;
    }
    auVar31 = vmovshdup_avx(auVar31);
    fVar27 = auVar31._0_4_;
    fVar29 = fVar29 * fVar27;
    if (fVar29 < 0.0) {
      fVar29 = sqrtf(fVar29);
    }
    else {
      auVar31 = vsqrtss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
      fVar29 = auVar31._0_4_;
    }
    fVar28 = fVar53 * (float)local_570._0_4_;
    if (fVar28 < 0.0) {
      fVar28 = sqrtf(fVar28);
    }
    else {
      auVar31 = vsqrtss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
      fVar28 = auVar31._0_4_;
    }
    fVar53 = fVar27 * fVar53;
    if (fVar53 < 0.0) {
      auVar63._0_4_ = sqrtf(fVar53);
      auVar63._4_60_ = extraout_var_01;
      auVar31 = auVar63._0_16_;
    }
    else {
      auVar31 = vsqrtss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53));
    }
    auVar4._4_4_ = fVar73;
    auVar4._0_4_ = fVar72;
    auVar4._8_4_ = fVar74;
    auVar4._12_4_ = fVar75;
    auVar40 = vshufps_avx(auVar4,auVar4,0x45);
    fVar27 = fVar27 * (float)local_570._0_4_;
    if (fVar27 < 0.0) {
      auVar50._0_4_ = sqrtf(fVar27);
      auVar50._4_60_ = extraout_var_02;
      auVar30 = auVar50._0_16_;
    }
    else {
      auVar30 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
    }
    auVar63 = ZEXT1664(auVar4);
    auVar36 = ZEXT464((uint)fVar67);
    auVar10._4_4_ = fVar69;
    auVar10._0_4_ = fVar68;
    auVar10._8_4_ = fVar70;
    auVar10._12_4_ = fVar71;
    auVar62 = ZEXT1664(auVar10);
    auVar11._4_4_ = fVar57;
    auVar11._0_4_ = fVar52;
    auVar11._8_4_ = fVar58;
    auVar11._12_4_ = fVar59;
    auVar31 = vinsertps_avx(auVar30,auVar31,0x10);
    auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)fVar28),0x20);
    auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)fVar29),0x30);
    auVar30 = vinsertps_avx(_local_510,ZEXT416((uint)(fVar67 * fVar46)),0x10);
    auVar47._4_4_ = local_440._0_4_;
    auVar47._0_4_ = local_440._0_4_;
    auVar47._8_4_ = local_440._0_4_;
    auVar47._12_4_ = local_440._0_4_;
    auVar41._0_8_ = auVar30._0_8_;
    auVar41._8_8_ = auVar47._8_8_;
    auVar30 = vshufps_avx(auVar41,auVar41,0xd4);
    auVar42._0_4_ = auVar40._0_4_ * auVar30._0_4_;
    auVar42._4_4_ = auVar40._4_4_ * auVar30._4_4_;
    auVar42._8_4_ = auVar40._8_4_ * auVar30._8_4_;
    auVar42._12_4_ = auVar40._12_4_ * auVar30._12_4_;
    auVar40 = vsubps_avx(auVar11,auVar42);
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar31 = vdivps_avx(auVar54,auVar31);
    auVar34._0_4_ = auVar40._0_4_ * auVar31._0_4_;
    auVar34._4_4_ = auVar40._4_4_ * auVar31._4_4_;
    auVar34._8_4_ = auVar40._8_4_ * auVar31._8_4_;
    auVar34._12_4_ = auVar40._12_4_ * auVar31._12_4_;
    auVar31 = vcmpps_avx(auVar34,ZEXT816(0) << 0x20,3);
    uVar13 = vmovmskps_avx(auVar31);
    fVar46 = auVar4._0_4_;
    auVar43._0_4_ = fVar67 * (float)local_440._0_4_;
    auVar43._4_4_ = fVar46 * (float)local_440._0_4_;
    auVar43._8_4_ = fVar46 * (float)local_440._0_4_;
    auVar43._12_4_ = fVar46 * (float)local_440._0_4_;
    auVar40 = vsubps_avx(auVar10,auVar43);
    auVar31 = vinsertps_avx(auVar33,ZEXT416((uint)fVar26),0x10);
    auVar31 = vdivps_avx(auVar54,auVar31);
    auVar48._0_4_ = auVar40._0_4_ * auVar31._0_4_;
    auVar48._4_4_ = auVar40._4_4_ * auVar31._4_4_;
    auVar48._8_4_ = auVar40._8_4_ * auVar31._8_4_;
    auVar48._12_4_ = auVar40._12_4_ * auVar31._12_4_;
    auVar44._8_4_ = 0x7fffffff;
    auVar44._0_8_ = 0x7fffffff7fffffff;
    auVar44._12_4_ = 0x7fffffff;
    auVar33 = vcmpps_avx(auVar48,ZEXT816(0) << 0x20,3);
    auVar31 = vandps_avx(auVar48,auVar44);
    auVar31 = vblendvps_avx(auVar31,auVar54,auVar33);
    auVar33 = vmovshdup_avx(auVar31);
    auVar33 = vminss_avx(auVar31,auVar33);
    auVar31 = SUB6416(ZEXT464(0x3f800000),0);
    if ((uVar13 & 8) == 0) {
      auVar31 = vshufps_avx(auVar34,auVar34,0xff);
      auVar31 = vandps_avx(auVar31,auVar44);
    }
    auVar33 = vminss_avx(auVar33,auVar31);
    auVar31 = SUB6416(ZEXT464(0x3f800000),0);
    if ((uVar13 & 4) == 0) {
      auVar31 = vshufpd_avx(auVar34,auVar34,1);
      auVar31 = vandpd_avx(auVar31,auVar44);
    }
    auVar33 = vminss_avx(auVar33,auVar31);
    auVar31 = SUB6416(ZEXT464(0x3f800000),0);
    if ((uVar13 & 2) == 0) {
      auVar31 = vmovshdup_avx(auVar34);
      auVar31 = vandps_avx(auVar31,auVar44);
    }
    auVar33 = vminss_avx(auVar33,auVar31);
    auVar31 = SUB6416(ZEXT464(0x3f800000),0);
    if ((uVar13 & 1) == 0) {
      auVar31 = vandps_avx(auVar34,auVar44);
    }
    auVar31 = vminss_avx(auVar33,auVar31);
    fVar26 = (ctx->config).tune_2plane_early_out_limit_correlation;
    fVar51 = fVar51 * fVar25;
    uVar13 = 0xb;
    if ((int)(uint)local_410 < 0xb) {
      uVar13 = (uint)local_410;
    }
    ei2 = &tmpbuf->ei2;
    dec_weight_ideal_value = tmpbuf->dec_weights_ideal;
    pdVar1 = bsd->decimation_tables;
    local_418 = tmpbuf->qwt_bitcounts;
    local_3d0 = tmpbuf->qwt_errors;
    local_514 = (float)local_430;
    fVar46 = (float)local_430 * 1.85;
    local_3d8 = &bsd->decimation_modes[0].refprec_2planes;
    local_3e0 = tmpbuf->weight_high_value2;
    local_3e8 = &bsd->block_modes[0].field_0x5;
    local_4d0 = 3;
    do {
      if ((auVar31._0_4_ <= fVar26) && ((local_4d0 == 3 || (blk->grayscale == false)))) {
        auVar35._4_4_ = local_4d0;
        auVar35._0_4_ = local_4d0;
        auVar35._8_4_ = local_4d0;
        auVar35._12_4_ = local_4d0;
        auVar40 = vpcmpeqd_avx(auVar35,_DAT_002773b0);
        auVar33 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                             *(undefined1 (*) [16])(blk->data_min).m,0);
        auVar33 = auVar40 & auVar33;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]
           ) {
          if ((ctx->config).tune_candidate_limit == 0) {
            __assert_fail("config.tune_candidate_limit > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x2d6,
                          "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                         );
          }
          if ((ctx->config).tune_refinement_limit == 0) {
            __assert_fail("config.tune_refinement_limit > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x2d7,
                          "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                         );
          }
          if (bsd->decimation_mode_count_selected == 0) {
            __assert_fail("bsd.decimation_mode_count_selected > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x2d8,
                          "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                         );
          }
          auVar36 = ZEXT1664(auVar36._0_16_);
          auVar62 = ZEXT1664(auVar62._0_16_);
          auVar63 = ZEXT1664(auVar63._0_16_);
          compute_ideal_colors_and_weights_2planes(bsd,blk,local_4d0,&tmpbuf->ei1,ei2);
          uVar14 = bsd->decimation_mode_count_selected;
          if (uVar14 != 0) {
            uVar15 = 0;
            uVar17 = 0;
            puVar18 = local_3d8;
            pdVar22 = pdVar1;
            do {
              if ((~(-2 << ((byte)uVar13 & 0x1f)) & (uint)*puVar18) != 0) {
                compute_ideal_weights_for_decimation
                          (&tmpbuf->ei1,pdVar22,dec_weight_ideal_value + uVar15);
                compute_ideal_weights_for_decimation
                          (ei2,pdVar22,dec_weight_ideal_value + (ulong)uVar15 + 0x20);
                uVar14 = bsd->decimation_mode_count_selected;
              }
              uVar17 = uVar17 + 1;
              uVar15 = uVar15 + 0x40;
              pdVar22 = pdVar22 + 1;
              puVar18 = puVar18 + 3;
            } while (uVar17 < uVar14);
          }
          uVar3 = *(undefined8 *)((tmpbuf->ei1).ep.endpt0[0].m + 2);
          local_570 = *(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt0[0].m;
          auVar33 = *(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt1[0].m;
          auVar30 = *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt0[0].m;
          auVar32 = *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt1[0].m;
          compute_angular_endpoints_2planes(bsd,dec_weight_ideal_value,uVar13,tmpbuf);
          uVar14 = bsd->block_mode_count_1plane_selected;
          uVar17 = (ulong)uVar14;
          uVar15 = bsd->block_mode_count_1plane_2plane_selected;
          if (uVar14 < uVar15) {
            auVar49._8_4_ = 0x3f800000;
            auVar49._0_8_ = 0x3f8000003f800000;
            auVar49._12_4_ = 0x3f800000;
            auVar64 = vsubps_avx(auVar49,auVar30);
            auVar30 = vsubps_avx(auVar32,auVar30);
            auVar64 = vdivps_avx(auVar64,auVar30);
            auVar55._8_4_ = 0x3f000000;
            auVar55._0_8_ = 0x3f0000003f000000;
            auVar55._12_4_ = 0x3f000000;
            auVar30 = vcmpps_avx(auVar55,auVar64,1);
            auVar60._8_4_ = 0x41200000;
            auVar60._0_8_ = 0x4120000041200000;
            auVar60._12_4_ = 0x41200000;
            auVar36 = ZEXT1664(auVar60);
            auVar32 = vcmpps_avx(auVar64,auVar60,1);
            auVar30 = vandps_avx(auVar30,auVar32);
            auVar30 = vblendvps_avx(auVar60,auVar64,auVar30);
            auVar61._8_4_ = 0x7149f2ca;
            auVar61._0_8_ = 0x7149f2ca7149f2ca;
            auVar61._12_4_ = 0x7149f2ca;
            auVar62 = ZEXT1664(auVar61);
            auVar63 = ZEXT1664(auVar40);
            auVar30 = vblendvps_avx(auVar61,auVar30,auVar40);
            auVar32 = vshufps_avx(auVar30,auVar30,0xe);
            auVar30 = vminps_avx(auVar30,auVar32);
            auVar32 = vmovshdup_avx(auVar30);
            auVar64 = vminss_avx(auVar30,auVar32);
            auVar30 = vsubps_avx(auVar49,local_570);
            auVar33 = vsubps_avx(auVar33,local_570);
            auVar32 = vdivps_avx(auVar30,auVar33);
            auVar33 = vcmpps_avx(auVar55,auVar32,1);
            auVar30 = vcmpps_avx(auVar32,auVar60,1);
            auVar33 = vandps_avx(auVar33,auVar30);
            auVar33 = vblendvps_avx(auVar60,auVar32,auVar33);
            auVar33 = vblendvps_avx(auVar33,auVar61,auVar40);
            auVar30 = vshufps_avx(auVar33,auVar33,0xe);
            auVar33 = vminps_avx(auVar33,auVar30);
            auVar30 = vmovshdup_avx(auVar33);
            auVar33 = vminss_avx(auVar33,auVar30);
            local_570._0_8_ = local_3e0 + uVar17;
            uVar23 = uVar17 << 6;
            local_440._0_8_ = local_418 + uVar17;
            pbVar21 = local_3e8 + uVar17 * 6;
            lVar19 = 0;
            local_570._8_8_ = uVar3;
            do {
              if ((*pbVar21 & 1) == 0) {
                __assert_fail("bm.is_dual_plane",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                              ,0x32a,
                              "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                             );
              }
              if (uVar13 < pbVar21[-2]) {
                *(float *)(local_570._0_8_ + (lVar19 + -0x2570) * 4) = 1e+38;
              }
              else {
                *(byte *)(local_440._0_8_ + lVar19) = 'm' - pbVar21[-1];
                fVar29 = *(float *)(local_570._0_8_ + (lVar19 + -0x1570) * 4);
                if (auVar33._0_4_ * 1.02 < fVar29) {
                  *(float *)(local_570._0_8_ + (lVar19 + -0x1570) * 4) = 1.0;
                  fVar29 = 1.0;
                }
                if (auVar64._0_4_ * 1.02 < *(float *)(local_570._0_8_ + lVar19 * 4)) {
                  *(float *)(local_570._0_8_ + lVar19 * 4) = 1.0;
                }
                bVar5 = pbVar21[-3];
                pdVar22 = pdVar1 + bVar5;
                compute_quantized_weights_for_decimation
                          (pdVar22,*(float *)(local_570._0_8_ + (lVar19 + -0x1d70) * 4),fVar29,
                           dec_weight_ideal_value + (ulong)bVar5 * 0x40,(float *)&local_220,
                           tmpbuf->dec_weights_uquant + (uVar23 & 0xffffffff),(uint)pbVar21[-2]);
                compute_quantized_weights_for_decimation
                          (pdVar22,*(float *)(local_570._0_8_ + (lVar19 + -0x800) * 4),
                           *(float *)(local_570._0_8_ + lVar19 * 4),
                           tmpbuf->dec_weights_ideal + (ulong)bVar5 * 0x40 + 0x20,
                           local_220.endpt1[3].m,
                           tmpbuf->dec_weights_uquant + (uVar23 & 0xffffffff) + 0x20,
                           (uint)pbVar21[-2]);
                fVar29 = compute_error_of_weight_set_2planes
                                   (&tmpbuf->ei1,ei2,pdVar22,(float *)&local_220,
                                    local_220.endpt1[3].m);
                *(float *)(local_570._0_8_ + (lVar19 + -0x2570) * 4) = fVar29;
              }
              lVar19 = lVar19 + 1;
              uVar23 = uVar23 + 0x40;
              pbVar21 = pbVar21 + 6;
            } while (uVar15 - uVar14 != (int)lVar19);
          }
          if ((tmpbuf->ei1).ep.partition_count != 1) {
            __assert_fail("partition_count == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x2c,
                          "void merge_endpoints(const endpoints &, const endpoints &, unsigned int, endpoints &)"
                         );
          }
          local_220.partition_count = 1;
          local_220.endpt0[0].m =
               (__m128)vblendvps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt0[0].m,
                                     *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt0[0].m,auVar40);
          local_220.endpt1[0].m =
               (__m128)vblendvps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt1[0].m,
                                     *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt1[0].m,auVar40);
          pi = block_size_descriptor::get_partition_info(bsd,1,0);
          uVar14 = compute_ideal_endpoint_formats
                             (pi,blk,&local_220,local_418,local_3d0,
                              (ctx->config).tune_candidate_limit,
                              bsd->block_mode_count_1plane_selected,
                              bsd->block_mode_count_1plane_2plane_selected,
                              (uint8_t (*) [4])local_240,local_260,local_280,local_110,tmpbuf);
          fVar29 = 1e+30;
          if (uVar14 != 0) {
            auVar56 = ZEXT464((uint)local_320._16_4_);
            uVar15 = 0;
            auVar50 = ZEXT464(0x7149f2ca);
            do {
              iVar16 = local_260[uVar15];
              if ((iVar16 < (int)bsd->block_mode_count_1plane_selected) ||
                 ((int)bsd->block_mode_count_1plane_2plane_selected <= iVar16)) {
                __assert_fail("bm_packed_index >= static_cast<int>(bsd.block_mode_count_1plane_selected) && bm_packed_index < static_cast<int>(bsd.block_mode_count_1plane_2plane_selected)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                              ,0x37b,
                              "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                             );
              }
              local_570._0_4_ = auVar50._0_4_;
              bVar5 = bsd->block_modes[iVar16].decimation_mode;
              uVar17 = (ulong)bsd->decimation_tables[bVar5].weight_count;
              if (uVar17 == 0) {
                __assert_fail("di.weight_count > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                              ,0x380,
                              "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                             );
              }
              local_440._0_8_ = bsd->block_modes + iVar16;
              auVar36 = ZEXT1664(auVar36._0_16_);
              auVar62 = ZEXT1664(auVar62._0_16_);
              auVar63 = ZEXT1664(auVar63._0_16_);
              memcpy(&local_f0,&local_220,0x90);
              uVar23 = 0;
              do {
                local_3a0[uVar23 + 0x40] = tmpbuf->dec_weights_uquant[uVar23 + (uint)(iVar16 << 6)];
                local_3a0[uVar23 + 0x60] =
                     tmpbuf->dec_weights_uquant[uVar23 + (uint)(iVar16 << 6) + 0x20];
                uVar23 = uVar23 + 1;
              } while (uVar17 != uVar23);
              auVar50 = ZEXT464(auVar50._0_4_);
              auVar56 = ZEXT464(auVar56._0_4_);
              if ((ctx->config).tune_refinement_limit != 0) {
                uVar20 = 0;
                iVar16 = -1;
                do {
                  fVar29 = auVar56._0_4_;
                  local_570._0_4_ = auVar50._0_4_;
                  auVar33 = auVar56._0_16_;
                  auVar36 = ZEXT1664(auVar36._0_16_);
                  auVar62 = ZEXT1664(auVar62._0_16_);
                  auVar63 = ZEXT1664(auVar63._0_16_);
                  recompute_ideal_colors_2planes
                            (blk,bsd,pdVar1 + bVar5,local_3a0 + 0x40,local_3a0 + 0x60,&local_f0,
                             &local_290,&local_2a0,local_4d0);
                  uVar17 = (ulong)uVar15;
                  color0.m._8_8_ = local_f0.endpt1[0].m._0_8_;
                  color0.m[0] = local_f0.endpt0[0].m[0];
                  color0.m[1] = local_f0.endpt0[0].m[1];
                  color1.m._0_8_ = local_290.m._0_8_;
                  color1.m[2] = local_2a0.m[0];
                  color1.m[3] = local_2a0.m[1];
                  rgbs_color_00.m._0_8_ = auVar33._0_8_;
                  rgbs_color_00.m._8_8_ = auVar36._0_8_;
                  rgbo_color_00.m._0_8_ = auVar62._0_8_;
                  rgbo_color_00.m._8_8_ = auVar63._0_8_;
                  uVar12 = pack_color_endpoints
                                     (color0,color1,rgbs_color_00,rgbo_color_00,
                                      (uint)*(byte *)((long)(local_220.endpt0 + -3) + uVar17 * 4),
                                      local_3a0 + 0x14,local_280[uVar17]);
                  auVar40 = auVar63._0_16_;
                  auVar33 = auVar62._0_16_;
                  local_3a0[8] = uVar12;
                  local_3a0[1] = '\x01';
                  local_3a0[2] = '\0';
                  local_3a0._6_2_ = 0;
                  local_3a0._12_4_ = local_280[uVar17];
                  local_3a0._4_2_ = *(undefined2 *)local_440._0_8_;
                  local_3a0[3] = (int8_t)local_4d0;
                  local_3a0[0] = '\x03';
                  if (uVar20 == 0) {
                    auVar56._0_4_ =
                         compute_symbolic_block_difference_2plane
                                   (&ctx->config,bsd,(symbolic_compressed_block *)local_3a0,blk);
                    auVar40 = auVar63._0_16_;
                    auVar33 = auVar62._0_16_;
                    auVar56._4_60_ = extraout_var_03;
                    if ((auVar56._0_4_ != -1e+30) || (NAN(auVar56._0_4_))) {
                      auVar36 = ZEXT1664(auVar56._0_16_);
                    }
                    else {
                      local_3a0[0] = '\0';
                      auVar36 = ZEXT464(0x7149f2ca);
                    }
                    auVar56 = ZEXT464((uint)fVar29);
                    auVar32 = auVar36._0_16_;
                    auVar30 = vminss_avx(auVar32,ZEXT416(auVar50._0_4_));
                    auVar50 = ZEXT1664(auVar30);
                    fVar53 = auVar36._0_4_;
                    if (fVar29 * ((float)(ctx->config).tune_refinement_limit * 0.045 + 1.08) <
                        fVar53) break;
                    local_570._0_4_ = auVar30._0_4_;
                    if (fVar29 <= fVar53) {
                      auVar32 = ZEXT416((uint)fVar29);
                    }
                    else {
                      local_3a0._16_4_ = fVar53;
                      local_320._32_4_ = (undefined4)local_3a0._32_8_;
                      local_320._36_4_ = SUB84(local_3a0._32_8_,4);
                      local_320._40_8_ = local_3a0._40_8_;
                      local_320._48_8_ = local_3a0._48_8_;
                      local_320._56_8_ = local_3a0._56_8_;
                      local_320._96_32_ = local_3a0._96_32_;
                      local_320[0] = local_3a0[0];
                      local_320[1] = (uint8_t)local_3a0._1_2_;
                      local_320._2_2_ =
                           (undefined2)
                           (CONCAT13(local_3a0[3],CONCAT21(local_3a0._1_2_,local_3a0[0])) >> 0x10);
                      local_320._4_2_ = local_3a0._4_2_;
                      local_320._6_2_ = local_3a0._6_2_;
                      local_320[8] = local_3a0[8];
                      local_320[9] = local_3a0[9];
                      local_320[10] = local_3a0[10];
                      local_320[0xb] = local_3a0[0xb];
                      local_320._12_4_ = local_3a0._12_4_;
                      local_320._16_4_ = fVar53;
                      local_320._20_4_ = local_3a0._20_4_;
                      local_320._24_4_ = (undefined4)local_3a0._24_8_;
                      local_320._28_4_ = SUB84(local_3a0._24_8_,4);
                      if (fVar53 < fVar51) {
                        auVar56 = ZEXT1664(auVar32);
                        auVar50 = ZEXT464(auVar30._0_4_);
                        uVar15 = uVar14;
                        break;
                      }
                    }
                  }
                  else {
                    auVar32 = ZEXT416((uint)fVar29);
                  }
                  fVar29 = auVar32._0_4_;
                  decode_mode = (ctx->config).profile;
                  if (pdVar1[bVar5].weight_count == bsd->texel_count) {
                    auVar36 = ZEXT1664(auVar32);
                    auVar62 = ZEXT1664(auVar33);
                    auVar63 = ZEXT1664(auVar40);
                    bVar24 = realign_weights_undecimated
                                       (decode_mode,bsd,blk,(symbolic_compressed_block *)local_3a0);
                  }
                  else {
                    auVar36 = ZEXT1664(auVar32);
                    auVar62 = ZEXT1664(auVar33);
                    auVar63 = ZEXT1664(auVar40);
                    bVar24 = realign_weights_decimated
                                       (decode_mode,bsd,blk,(symbolic_compressed_block *)local_3a0);
                  }
                  auVar37._0_4_ =
                       compute_symbolic_block_difference_2plane
                                 (&ctx->config,bsd,(symbolic_compressed_block *)local_3a0,blk);
                  auVar37._4_60_ = extraout_var_04;
                  if ((auVar37._0_4_ != -1e+30) || (NAN(auVar37._0_4_))) {
                    auVar56 = ZEXT1664(auVar37._0_16_);
                  }
                  else {
                    local_3a0[0] = '\0';
                    auVar56 = ZEXT464(0x7149f2ca);
                  }
                  auVar33 = vminss_avx(auVar56._0_16_,ZEXT416((uint)local_570._0_4_));
                  auVar50 = ZEXT1664(auVar33);
                  uVar8 = (ctx->config).tune_refinement_limit;
                  fVar53 = auVar56._0_4_;
                  auVar33 = ZEXT416((uint)fVar29);
                  if (fVar29 * ((float)(iVar16 + uVar8) * 0.045 + 1.0) < fVar53) {
                    auVar56 = ZEXT1664(auVar33);
                    break;
                  }
                  if (fVar29 <= fVar53) {
                    auVar56 = ZEXT1664(auVar33);
                    if (bVar24 == false) {
                      auVar56 = ZEXT1664(auVar33);
                      break;
                    }
                  }
                  else {
                    local_3a0._16_4_ = fVar53;
                    local_320._32_4_ = (undefined4)local_3a0._32_8_;
                    local_320._36_4_ = SUB84(local_3a0._32_8_,4);
                    local_320._40_8_ = local_3a0._40_8_;
                    local_320._48_8_ = local_3a0._48_8_;
                    local_320._56_8_ = local_3a0._56_8_;
                    local_320._96_32_ = local_3a0._96_32_;
                    local_320[0] = local_3a0[0];
                    local_320[1] = (uint8_t)local_3a0._1_2_;
                    local_320._2_2_ =
                         (undefined2)
                         (CONCAT13(local_3a0[3],CONCAT21(local_3a0._1_2_,local_3a0[0])) >> 0x10);
                    local_320._4_2_ = local_3a0._4_2_;
                    local_320._6_2_ = local_3a0._6_2_;
                    local_320._8_8_ =
                         (undefined8)
                         (CONCAT46(local_3a0._12_4_,CONCAT42(local_3a0._8_4_,local_3a0._6_2_)) >>
                         0x10);
                    local_320._16_4_ = fVar53;
                    local_320._20_4_ = local_3a0._20_4_;
                    local_320._24_4_ = (undefined4)local_3a0._24_8_;
                    local_320._28_4_ = SUB84(local_3a0._24_8_,4);
                    if ((bVar24 & fVar51 <= fVar53) == 0) {
                      if (fVar53 < fVar51) {
                        uVar15 = uVar14;
                      }
                      break;
                    }
                  }
                  uVar20 = uVar20 + 1;
                  iVar16 = iVar16 + -1;
                } while (uVar20 < uVar8);
              }
              fVar29 = auVar50._0_4_;
              uVar15 = uVar15 + 1;
            } while (uVar15 < uVar14);
          }
          if (fVar46 < fVar29) break;
          if (fVar29 < fVar25) goto LAB_00266048;
        }
      }
      bVar24 = local_4d0 != 0;
      local_4d0 = local_4d0 - 1;
    } while (bVar24);
    if (1 < (int)uVar7) {
      lVar19 = 2;
      do {
        uVar13 = local_3b8[lVar19];
        uVar14 = *(uint *)((long)&local_3c8 + lVar19 * 4);
        if (uVar13 <= uVar14) {
          uVar14 = uVar13;
        }
        uVar13 = find_best_partition_candidates
                           (bsd,blk,(uint)lVar19,uVar13,&local_220.partition_count,uVar14);
        if (uVar13 == 0) {
          fVar26 = local_408[lVar19 + 1];
          fVar46 = *(float *)(local_440 + lVar19 * 4 + 0xc);
        }
        else {
          uVar17 = 0;
          do {
            auVar38._0_4_ =
                 compress_symbolic_block_for_partition_1plane
                           (&ctx->config,bsd,blk,false,fVar51,(uint)lVar19,
                            (&((endpoints *)(local_220.endpt0 + -1))->partition_count)[uVar17],
                            (symbolic_compressed_block *)local_320,tmpbuf,(int)local_410);
            auVar38._4_60_ = extraout_var_05;
            auVar31 = vminss_avx(ZEXT416(*(uint *)(local_440 + lVar19 * 4 + 0xc)),auVar38._0_16_);
            fVar46 = auVar31._0_4_;
            *(float *)(local_440 + lVar19 * 4 + 0xc) = fVar46;
            fVar26 = local_408[lVar19 + 1];
            if ((fVar26 * 1.85 * local_514 < fVar46) || (auVar38._0_4_ < fVar25)) goto LAB_00266048;
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
        }
      } while ((fVar46 <= fVar26 * local_514) &&
              (lVar19 = lVar19 + 1, local_514 = fVar46, lVar19 != (ulong)uVar7 + 1));
    }
LAB_00266048:
    pcb = local_3c8;
    if (local_320[0] == '\0') {
      local_320[0] = '\x02';
      auVar31 = vmaxps_avx(*(undefined1 (*) [16])(blk->origin_texel).m,ZEXT816(0) << 0x40);
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar31 = vminps_avx(auVar31,auVar45);
      local_320._20_4_ = (undefined4)(auVar31._0_4_ * 65535.0 + 0.5);
      local_320._24_4_ = (undefined4)(auVar31._4_4_ * 65535.0 + 0.5);
      local_320._28_4_ = (undefined4)(auVar31._8_4_ * 65535.0 + 0.5);
      local_320._32_4_ = (undefined4)(auVar31._12_4_ * 65535.0 + 0.5);
    }
  }
  symbolic_to_physical(bsd,(symbolic_compressed_block *)local_320,pcb);
  return;
}

Assistant:

void compress_block(
	const astcenc_contexti& ctx,
	const image_block& blk,
	uint8_t pcb[16],
	compression_working_buffers& tmpbuf)
{
	astcenc_profile decode_mode = ctx.config.profile;
	symbolic_compressed_block scb;
	const block_size_descriptor& bsd = *ctx.bsd;
	float lowest_correl;

	TRACE_NODE(node0, "block");
	trace_add_data("pos_x", blk.xpos);
	trace_add_data("pos_y", blk.ypos);
	trace_add_data("pos_z", blk.zpos);

	// Set stricter block targets for luminance data as we have more bits to play with
	bool block_is_l = blk.is_luminance();
	float block_is_l_scale = block_is_l ? 1.0f / 1.5f : 1.0f;

	// Set slightly stricter block targets for lumalpha data as we have more bits to play with
	bool block_is_la = blk.is_luminancealpha();
	float block_is_la_scale = block_is_la ? 1.0f / 1.05f : 1.0f;

	bool block_skip_two_plane = false;
	int max_partitions = ctx.config.tune_partition_count_limit;

	unsigned int requested_partition_indices[3] {
		ctx.config.tune_2partition_index_limit,
		ctx.config.tune_3partition_index_limit,
		ctx.config.tune_4partition_index_limit
	};

	unsigned int requested_partition_trials[3] {
		ctx.config.tune_2partitioning_candidate_limit,
		ctx.config.tune_3partitioning_candidate_limit,
		ctx.config.tune_4partitioning_candidate_limit
	};

#if defined(ASTCENC_DIAGNOSTICS)
	// Do this early in diagnostic builds so we can dump uniform metrics
	// for every block. Do it later in release builds to avoid redundant work!
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;

	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
	trace_add_data("lowest_correl", lowest_correl);
	trace_add_data("tune_error_threshold", error_threshold);
#endif

	// Detected a constant-color block
	if (all(blk.data_min == blk.data_max))
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 0);
		trace_add_data("plane_count", 1);

		scb.partition_count = 0;

		// Encode as FP16 if using HDR
		if ((decode_mode == ASTCENC_PRF_HDR) ||
		    (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A))
		{
			scb.block_type = SYM_BTYPE_CONST_F16;
			vint4 color_f16 = float_to_float16(blk.origin_texel);
			store(color_f16, scb.constant_color);
		}
		// Encode as UNORM16 if NOT using HDR
		else
		{
			scb.block_type = SYM_BTYPE_CONST_U16;
			vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
			vint4 color_u16 = float_to_int_rtn(color_f32);
			store(color_u16, scb.constant_color);
		}

		trace_add_data("exit", "quality hit");

		symbolic_to_physical(bsd, scb, pcb);
		return;
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;
#endif

	// Set SCB and mode errors to a very high error value
	scb.errorval = ERROR_CALC_DEFAULT;
	scb.block_type = SYM_BTYPE_ERROR;

	float best_errorvals_for_pcount[BLOCK_MAX_PARTITIONS] {
		ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT
	};

	float exit_thresholds_for_pcount[BLOCK_MAX_PARTITIONS] {
		0.0f,
		ctx.config.tune_2partition_early_out_limit_factor,
		ctx.config.tune_3partition_early_out_limit_factor,
		0.0f
	};

	// Trial using 1 plane of weights and 1 partition.

	// Most of the time we test it twice, first with a mode cutoff of 0 and then with the specified
	// mode cutoff. This causes an early-out that speeds up encoding of easy blocks. However, this
	// optimization is disabled for 4x4 and 5x4 blocks where it nearly always slows down the
	// compression and slightly reduces image quality.

	float errorval_mult[2] {
		1.0f / ctx.config.tune_mse_overshoot,
		1.0f
	};

	const float errorval_overshoot = 1.0f / ctx.config.tune_mse_overshoot;

	// Only enable MODE0 fast path if enabled
	// Never enable for 3D blocks as no "always" block modes are available
	int start_trial = 1;
 	if ((ctx.config.tune_search_mode0_enable >= TUNE_MIN_SEARCH_MODE0) && (bsd.zdim == 1))
	{
		start_trial = 0;
	}

	int quant_limit = QUANT_32;
	for (int i = start_trial; i < 2; i++)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 1);
		trace_add_data("search_mode", i);

		float errorval = compress_symbolic_block_for_partition_1plane(
		    ctx.config, bsd, blk, i == 0,
		    error_threshold * errorval_mult[i] * errorval_overshoot,
		    1, 0,  scb, tmpbuf, QUANT_32);

		// Record the quant level so we can use the filter later searches
		const auto& bm = bsd.get_block_mode(scb.block_mode);
		quant_limit = bm.get_weight_quant_mode();

		best_errorvals_for_pcount[0] = astc::min(best_errorvals_for_pcount[0], errorval);
		if (errorval < (error_threshold * errorval_mult[i]))
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
#endif

	block_skip_two_plane = lowest_correl > ctx.config.tune_2plane_early_out_limit_correlation;

	// Test the four possible 1-partition, 2-planes modes. Do this in reverse, as
	// alpha is the most likely to be non-correlated if it is present in the data.
	for (int i = BLOCK_MAX_COMPONENTS - 1; i >= 0; i--)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 2);
		trace_add_data("plane_component", i);

		if (block_skip_two_plane)
		{
			trace_add_data("skip", "tune_2plane_early_out_limit_correlation");
			continue;
		}

		if (blk.grayscale && i != 3)
		{
			trace_add_data("skip", "grayscale block");
			continue;
		}

		if (blk.is_constant_channel(i))
		{
			trace_add_data("skip", "constant component");
			continue;
		}

		float errorval = compress_symbolic_block_for_partition_2planes(
		    ctx.config, bsd, blk, error_threshold * errorval_overshoot,
		    i, scb, tmpbuf, quant_limit);

		// If attempting two planes is much worse than the best one plane result
		// then further two plane searches are unlikely to help so move on ...
		if (errorval > (best_errorvals_for_pcount[0] * 1.85f))
		{
			break;
		}

		if (errorval < error_threshold)
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

	// Find best blocks for 2, 3 and 4 partitions
	for (int partition_count = 2; partition_count <= max_partitions; partition_count++)
	{
		unsigned int partition_indices[TUNE_MAX_PARTITIONING_CANDIDATES];

		unsigned int requested_indices = requested_partition_indices[partition_count - 2];

		unsigned int requested_trials = requested_partition_trials[partition_count - 2];
		requested_trials = astc::min(requested_trials, requested_indices);

		unsigned int actual_trials = find_best_partition_candidates(
		    bsd, blk, partition_count, requested_indices, partition_indices, requested_trials);

		float best_error_in_prev = best_errorvals_for_pcount[partition_count - 2];

		for (unsigned int i = 0; i < actual_trials; i++)
		{
			TRACE_NODE(node1, "pass");
			trace_add_data("partition_count", partition_count);
			trace_add_data("partition_index", partition_indices[i]);
			trace_add_data("plane_count", 1);
			trace_add_data("search_mode", i);

			float errorval = compress_symbolic_block_for_partition_1plane(
			    ctx.config, bsd, blk, false,
			    error_threshold * errorval_overshoot,
			    partition_count, partition_indices[i],
			    scb, tmpbuf, quant_limit);

			best_errorvals_for_pcount[partition_count - 1] = astc::min(best_errorvals_for_pcount[partition_count - 1], errorval);

			// If using N partitions doesn't improve much over using N-1 partitions then skip trying
			// N+1. Error can dramatically improve if the data is correlated or non-correlated and
			// aligns with a partitioning that suits that encoding, so for this inner loop check add
			// a large error scale because the "other" trial could be a lot better.
			float best_error = best_errorvals_for_pcount[partition_count - 1];
			float best_error_scale = exit_thresholds_for_pcount[partition_count - 1] * 1.85f;
			if (best_error > (best_error_in_prev * best_error_scale))
			{
				trace_add_data("skip", "tune_partition_early_out_limit_factor");
				goto END_OF_TESTS;
			}

			if (errorval < error_threshold)
			{
				trace_add_data("exit", "quality hit");
				goto END_OF_TESTS;
			}
		}

		// If using N partitions doesn't improve much over using N-1 partitions then skip trying N+1
		float best_error = best_errorvals_for_pcount[partition_count - 1];
		float best_error_scale = exit_thresholds_for_pcount[partition_count - 1];
		if (best_error > (best_error_in_prev * best_error_scale))
		{
			trace_add_data("skip", "tune_partition_early_out_limit_factor");
			goto END_OF_TESTS;
		}
	}

	trace_add_data("exit", "quality not hit");

END_OF_TESTS:
	// If we still have an error block then convert to something we can encode
	// TODO: Do something more sensible here, such as average color block
	if (scb.block_type == SYM_BTYPE_ERROR)
	{
#if defined(ASTCENC_DIAGNOSTICS)
		static bool printed_once = false;
		if (!printed_once)
		{
			printed_once = true;
			printf("WARN: At least one block failed to find a valid encoding.\n"
			       "      Try increasing compression quality settings.\n\n");
		}
#endif

		scb.block_type = SYM_BTYPE_CONST_U16;
		vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
		vint4 color_u16 = float_to_int_rtn(color_f32);
		store(color_u16, scb.constant_color);
	}

	// Compress to a physical block
	symbolic_to_physical(bsd, scb, pcb);
}